

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffercache.h
# Opt level: O0

Point3<float> * __thiscall
pbrt::BufferCache<pbrt::Point3<float>_>::LookupOrAdd
          (BufferCache<pbrt::Point3<float>_> *this,span<const_pbrt::Point3<float>_> buf,
          Allocator alloc)

{
  Point3<float> *pPVar1;
  bool bVar2;
  Buffer *this_00;
  size_t sVar3;
  pointer pBVar4;
  long in_RDI;
  long *in_FS_OFFSET;
  Point3<float> *cachePtr;
  iterator iter_1;
  Point3<float> *ptr;
  Point3<float> *ptr_1;
  iterator iter;
  int shardIndex;
  Buffer lookupBuffer;
  unordered_set<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer,_pbrt::BufferCache<pbrt::Point3<float>_>::BufferHasher,_std::equal_to<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer>,_std::allocator<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer>_>
  *in_stack_ffffffffffffff28;
  Point3<float> *in_stack_ffffffffffffff30;
  value_type *in_stack_ffffffffffffff38;
  Buffer *in_stack_ffffffffffffff40;
  _Node_iterator_base<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer,_true> local_78;
  _Node_iterator_base<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer,_true> local_70;
  Point3<float> *local_68;
  Point3<float> *local_60;
  _Node_iterator_base<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer,_true> local_58;
  _Node_iterator_base<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer,_true> local_50;
  uint local_44;
  ulong local_30;
  span<const_pbrt::Point3<float>_> local_18;
  Point3<float> *local_8;
  
  *(long *)(*in_FS_OFFSET + -0x378) = *(long *)(*in_FS_OFFSET + -0x378) + 1;
  pstd::span<const_pbrt::Point3<float>_>::data(&local_18);
  pstd::span<const_pbrt::Point3<float>_>::size(&local_18);
  Buffer::Buffer(in_stack_ffffffffffffff40,(Point3<float> *)in_stack_ffffffffffffff38,
                 (size_t)in_stack_ffffffffffffff30);
  local_44 = (uint)(local_30 >> 0x1a) & 0x3f;
  std::shared_mutex::lock_shared((shared_mutex *)0x57963f);
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_set<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer,_pbrt::BufferCache<pbrt::Point3<float>_>::BufferHasher,_std::equal_to<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer>,_std::allocator<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer>_>
       ::find(in_stack_ffffffffffffff28,(key_type *)0x579667);
  local_58._M_cur =
       (__node_type *)
       std::
       unordered_set<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer,_pbrt::BufferCache<pbrt::Point3<float>_>::BufferHasher,_std::equal_to<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer>,_std::allocator<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer>_>
       ::end(in_stack_ffffffffffffff28);
  bVar2 = std::__detail::operator!=(&local_50,&local_58);
  if (bVar2) {
    pBVar4 = std::__detail::
             _Node_iterator<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer,_true,_true>::operator->
                       ((_Node_iterator<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer,_true,_true>
                         *)0x5796c2);
    local_60 = pBVar4->ptr;
    std::shared_mutex::unlock_shared((shared_mutex *)0x5796e3);
    *(long *)(*in_FS_OFFSET + -0x380) = *(long *)(*in_FS_OFFSET + -0x380) + 1;
    sVar3 = pstd::span<const_pbrt::Point3<float>_>::size(&local_18);
    *(long *)(*in_FS_OFFSET + -0x388) = sVar3 * 0xc + *(long *)(*in_FS_OFFSET + -0x388);
    local_8 = local_60;
  }
  else {
    std::shared_mutex::unlock_shared((shared_mutex *)0x579751);
    pstd::span<const_pbrt::Point3<float>_>::size(&local_18);
    local_68 = pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<pbrt::Point3<float>>
                         ((polymorphic_allocator<std::byte> *)in_stack_ffffffffffffff30,
                          (size_t)in_stack_ffffffffffffff28);
    this_00 = (Buffer *)pstd::span<const_pbrt::Point3<float>_>::begin(&local_18);
    pstd::span<const_pbrt::Point3<float>_>::end(&local_18);
    std::copy<pbrt::Point3<float>const*,pbrt::Point3<float>*>
              ((Point3<float> *)this_00,(Point3<float> *)in_stack_ffffffffffffff38,
               in_stack_ffffffffffffff30);
    sVar3 = pstd::span<const_pbrt::Point3<float>_>::size(&local_18);
    std::__atomic_base<unsigned_long>::operator+=
              ((__atomic_base<unsigned_long> *)(in_RDI + 0x1c00),sVar3 * 0xc);
    std::shared_mutex::lock((shared_mutex *)0x5797df);
    local_70._M_cur =
         (__node_type *)
         std::
         unordered_set<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer,_pbrt::BufferCache<pbrt::Point3<float>_>::BufferHasher,_std::equal_to<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer>,_std::allocator<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer>_>
         ::find(in_stack_ffffffffffffff28,(key_type *)0x579807);
    local_78._M_cur =
         (__node_type *)
         std::
         unordered_set<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer,_pbrt::BufferCache<pbrt::Point3<float>_>::BufferHasher,_std::equal_to<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer>,_std::allocator<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer>_>
         ::end(in_stack_ffffffffffffff28);
    bVar2 = std::__detail::operator!=(&local_70,&local_78);
    if (bVar2) {
      pBVar4 = std::__detail::
               _Node_iterator<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer,_true,_true>::
               operator->((_Node_iterator<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer,_true,_true>
                           *)0x579853);
      pPVar1 = pBVar4->ptr;
      std::shared_mutex::unlock((shared_mutex *)0x579874);
      pstd::span<const_pbrt::Point3<float>_>::size(&local_18);
      pstd::pmr::polymorphic_allocator<std::byte>::deallocate_object<pbrt::Point3<float>>
                ((polymorphic_allocator<std::byte> *)in_stack_ffffffffffffff30,
                 (Point3<float> *)in_stack_ffffffffffffff28,0x5798a0);
      *(long *)(*in_FS_OFFSET + -0x380) = *(long *)(*in_FS_OFFSET + -0x380) + 1;
      sVar3 = pstd::span<const_pbrt::Point3<float>_>::size(&local_18);
      *(long *)(*in_FS_OFFSET + -0x388) = sVar3 * 0xc + *(long *)(*in_FS_OFFSET + -0x388);
      local_8 = pPVar1;
    }
    else {
      sVar3 = in_RDI + 0xe00 + (long)(int)local_44 * 0x38;
      pstd::span<const_pbrt::Point3<float>_>::size(&local_18);
      Buffer::Buffer(this_00,(Point3<float> *)in_stack_ffffffffffffff38,sVar3);
      std::
      unordered_set<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer,_pbrt::BufferCache<pbrt::Point3<float>_>::BufferHasher,_std::equal_to<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer>,_std::allocator<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer>_>
      ::insert((unordered_set<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer,_pbrt::BufferCache<pbrt::Point3<float>_>::BufferHasher,_std::equal_to<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer>,_std::allocator<pbrt::BufferCache<pbrt::Point3<float>_>::Buffer>_>
                *)this_00,in_stack_ffffffffffffff38);
      std::shared_mutex::unlock((shared_mutex *)0x57996a);
      local_8 = local_68;
    }
  }
  return local_8;
}

Assistant:

const T *LookupOrAdd(pstd::span<const T> buf, Allocator alloc) {
        ++nBufferCacheLookups;
        // Return pointer to data if _buf_ contents are already in the cache
        Buffer lookupBuffer(buf.data(), buf.size());
        int shardIndex = uint32_t(lookupBuffer.hash) >> (32 - logShards);
        DCHECK(shardIndex >= 0 && shardIndex < nShards);
        mutex[shardIndex].lock_shared();
        if (auto iter = cache[shardIndex].find(lookupBuffer);
            iter != cache[shardIndex].end()) {
            const T *ptr = iter->ptr;
            mutex[shardIndex].unlock_shared();
            DCHECK(std::memcmp(buf.data(), iter->ptr, buf.size() * sizeof(T)) == 0);
            ++nBufferCacheHits;
            redundantBufferBytes += buf.size() * sizeof(T);
            return ptr;
        }

        // Add _buf_ contents to cache and return pointer to cached copy
        mutex[shardIndex].unlock_shared();
        T *ptr = alloc.allocate_object<T>(buf.size());
        std::copy(buf.begin(), buf.end(), ptr);
        bytesUsed += buf.size() * sizeof(T);
        mutex[shardIndex].lock();
        // Handle the case of another thread adding the buffer first
        if (auto iter = cache[shardIndex].find(lookupBuffer);
            iter != cache[shardIndex].end()) {
            const T *cachePtr = iter->ptr;
            mutex[shardIndex].unlock();
            alloc.deallocate_object(ptr, buf.size());
            ++nBufferCacheHits;
            redundantBufferBytes += buf.size() * sizeof(T);
            return cachePtr;
        }

        cache[shardIndex].insert(Buffer(ptr, buf.size()));
        mutex[shardIndex].unlock();
        return ptr;
    }